

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_capacity_suite.cpp
# Opt level: O0

void max_size_suite::test_real(void)

{
  undefined4 local_fc;
  size_type local_f8 [2];
  undefined1 local_e8 [8];
  variable data_2;
  undefined4 local_ac;
  size_type local_a8 [2];
  undefined1 local_98 [8];
  variable data_1;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,1.0);
  local_48[0] = trial::dynamic::basic_variable<std::allocator<char>_>::max_size
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.max_size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x1b2,"void max_size_suite::test_real()",local_48,&local_4c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_98,1.0);
  local_a8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::max_size
                          ((basic_variable<std::allocator<char>_> *)local_98);
  local_ac = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.max_size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x1b6,"void max_size_suite::test_real()",local_a8,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_e8,(longdouble)1);
  local_f8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::max_size
                          ((basic_variable<std::allocator<char>_> *)local_e8);
  local_fc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.max_size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x1ba,"void max_size_suite::test_real()",local_f8,&local_fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  return;
}

Assistant:

void test_real()
{
    {
        variable data(1.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.max_size(), 1);
    }
    {
        variable data(1.0);
        TRIAL_PROTOCOL_TEST_EQUAL(data.max_size(), 1);
    }
    {
        variable data(1.0L);
        TRIAL_PROTOCOL_TEST_EQUAL(data.max_size(), 1);
    }
}